

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int message_get_body_amqp_data_count(MESSAGE_HANDLE message,size_t *count)

{
  MESSAGE_BODY_TYPE MVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (message == (MESSAGE_HANDLE)0x0 || count == (size_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x482;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_get_body_amqp_data_count",0x481,1,
                "Bad arguments: message = %p, count = %p",message,count);
    }
  }
  else {
    MVar1 = internal_get_body_type(message);
    if (MVar1 == MESSAGE_BODY_TYPE_DATA) {
      *count = message->body_amqp_data_count;
      iVar3 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0x48b;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_get_body_amqp_data_count",0x48a,1,"Body type is not AMQP data");
      }
    }
  }
  return iVar3;
}

Assistant:

int message_get_body_amqp_data_count(MESSAGE_HANDLE message, size_t* count)
{
    int result;

    if ((message == NULL) ||
        (count == NULL))
    {
        /* Codes_SRS_MESSAGE_01_099: [ If `message` or `count` is NULL, `message_get_body_amqp_data_count` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, count = %p",
            message, count);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if (body_type != MESSAGE_BODY_TYPE_DATA)
        {
            /* Codes_SRS_MESSAGE_01_100: [ If the body for `message` is not of type `MESSAGE_BODY_TYPE_DATA`, `message_get_body_amqp_data_count` shall fail and return a non-zero value. ]*/
            LogError("Body type is not AMQP data");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_097: [ `message_get_body_amqp_data_count` shall fill in `count` the number of AMQP data chunks that are stored by the message identified by `message`. ]*/
            *count = message->body_amqp_data_count;

            /* Codes_SRS_MESSAGE_01_098: [ On success, `message_get_body_amqp_data_count` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}